

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O0

void diy::Serialization<diy::DynamicPoint<int,_4UL>_>::load(BinaryBuffer *bb,Point *p)

{
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  size_t s;
  size_type in_stack_00000028;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_stack_00000030;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::resize
            (in_stack_00000030,in_stack_00000028);
  if (local_18 != 0) {
    itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
              (in_RDI,(size_type)in_stack_ffffffffffffffd8);
    load<int>((BinaryBuffer *)in_RDI,(int *)in_stack_ffffffffffffffd8,0x167d1e);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Point& p)
    {
      size_t s;
      diy::load(bb, s);
      p.resize(s);
      if (s > 0)
        diy::load(bb, &p[0], s);
    }